

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  Filter *pFVar1;
  Filter *pFVar2;
  bool bVar3;
  Filter *this_00;
  Filter *filter;
  
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pFVar2 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    this_00 = pFVar2;
    if (this_00 == pFVar1) break;
    bVar3 = Filter::matches(this_00,testCase);
    pFVar2 = this_00 + 1;
  } while (!bVar3);
  return this_00 != pFVar1;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        // A TestSpec matches if any filter matches
        for( auto const& filter : m_filters )
            if( filter.matches( testCase ) )
                return true;
        return false;
    }